

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngrams_raw.c
# Opt level: O0

void read_dmp_weight_array
               (FILE *fp,logmath_t *lmath,uint8 do_swap,int32 counts,ngram_raw_t *raw_ngrams,
               int weight_idx)

{
  void *__ptr;
  float fVar1;
  dmp_weight_t *tmp_weight_arr;
  int local_30;
  int32 k;
  int32 i;
  int weight_idx_local;
  ngram_raw_t *raw_ngrams_local;
  int32 counts_local;
  uint8 do_swap_local;
  logmath_t *lmath_local;
  FILE *fp_local;
  
  k = weight_idx;
  _i = raw_ngrams;
  raw_ngrams_local._0_4_ = counts;
  raw_ngrams_local._7_1_ = do_swap;
  _counts_local = lmath;
  lmath_local = (logmath_t *)fp;
  fread((void *)((long)&tmp_weight_arr + 4),4,1,(FILE *)fp);
  if (raw_ngrams_local._7_1_ != '\0') {
    tmp_weight_arr._4_4_ =
         (int)tmp_weight_arr._4_4_ >> 0x18 & 0xffU | (int)tmp_weight_arr._4_4_ >> 8 & 0xff00U |
         (tmp_weight_arr._4_4_ & 0xff00) << 8 | tmp_weight_arr._4_4_ << 0x18;
  }
  __ptr = __ckd_calloc__((long)(int)tmp_weight_arr._4_4_,4,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngrams_raw.c"
                         ,0xd3);
  fread(__ptr,4,(long)(int)tmp_weight_arr._4_4_,(FILE *)lmath_local);
  for (local_30 = 0; local_30 < (int)tmp_weight_arr._4_4_; local_30 = local_30 + 1) {
    if (raw_ngrams_local._7_1_ != '\0') {
      *(uint *)((long)__ptr + (long)local_30 * 4) =
           *(int *)((long)__ptr + (long)local_30 * 4) >> 0x18 & 0xffU |
           *(int *)((long)__ptr + (long)local_30 * 4) >> 8 & 0xff00U |
           (*(uint *)((long)__ptr + (long)local_30 * 4) & 0xff00) << 8 |
           *(int *)((long)__ptr + (long)local_30 * 4) << 0x18;
    }
    fVar1 = logmath_log10_to_log_float
                      (_counts_local,(float64)(double)*(float *)((long)__ptr + (long)local_30 * 4));
    *(float *)((long)__ptr + (long)local_30 * 4) = fVar1;
  }
  for (local_30 = 0; local_30 < (int32)raw_ngrams_local; local_30 = local_30 + 1) {
    if (k == 0) {
      _i[local_30].prob = *(float32 *)((long)__ptr + (long)(int)(float)_i[local_30].prob * 4);
    }
    else {
      _i[local_30].backoff = *(float32 *)((long)__ptr + (long)(int)(float)_i[local_30].backoff * 4);
    }
  }
  ckd_free(__ptr);
  return;
}

Assistant:

static void
read_dmp_weight_array(FILE * fp, logmath_t * lmath, uint8 do_swap,
                      int32 counts, ngram_raw_t * raw_ngrams,
                      int weight_idx)
{
    int32 i, k;
    dmp_weight_t *tmp_weight_arr;

    fread(&k, sizeof(k), 1, fp);
    if (do_swap)
        SWAP_INT32(&k);
    tmp_weight_arr =
        (dmp_weight_t *) ckd_calloc(k, sizeof(*tmp_weight_arr));
    fread(tmp_weight_arr, sizeof(*tmp_weight_arr), k, fp);
    for (i = 0; i < k; i++) {
        if (do_swap)
            SWAP_INT32(&tmp_weight_arr[i].l);
        /* Convert values to log. */
        tmp_weight_arr[i].f =
            logmath_log10_to_log_float(lmath, tmp_weight_arr[i].f);
    }
    /* replace indexes with real probs in raw bigrams */
    for (i = 0; i < counts; i++) {
	if (weight_idx == 0) {
	    raw_ngrams[i].prob =
                tmp_weight_arr[(int) raw_ngrams[i].prob].f;
        } else {
	    raw_ngrams[i].backoff =
                tmp_weight_arr[(int) raw_ngrams[i].backoff].f;
        }
    }
    ckd_free(tmp_weight_arr);
}